

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Config.cpp
# Opt level: O1

void __thiscall xmrig::Config::getJSON(Config *this,Document *doc)

{
  uint uVar1;
  MemoryPoolAllocator<rapidjson::CrtAllocator> *allocator;
  Value api;
  Data local_88;
  Data local_78;
  Data local_68;
  StringRefType local_50;
  StringRefType local_40;
  
  (doc->
  super_GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
  ).data_.n = (Number)0x0;
  (doc->
  super_GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
  ).data_.s.str = (Ch *)0x0;
  (doc->
  super_GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
  ).data_.f.flags = 3;
  allocator = doc->allocator_;
  local_68.n = (Number)0x0;
  local_68.s.str = (Ch *)0x3000000000000;
  String::toJSON((String *)&local_88.s);
  local_78.s.str = (Ch *)0x40500000018a1a3;
  local_78.n = (Number)0x2;
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  AddMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             *)&local_68.s,
            (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             *)&local_78.s,
            (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             *)&local_88.s,allocator);
  String::toJSON((String *)&local_88.s);
  local_78.s.str = (Ch *)0x40500000018a211;
  local_78.n = (Number)0x9;
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  AddMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             *)&local_68.s,
            (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             *)&local_78.s,
            (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             *)&local_88.s,allocator);
  local_78.s.str = (Ch *)0x40500000018a07b;
  local_78.n = (Number)0x3;
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  AddMember(&doc->
             super_GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
            ,(GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              *)&local_78.s,
            (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             *)&local_68.s,allocator);
  Http::toJSON((Http *)&local_88.s,(Document *)&(this->super_BaseConfig).m_http);
  local_78.s.str = (Ch *)0x40500000018a07f;
  local_78.n = (Number)0x4;
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  AddMember(&doc->
             super_GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
            ,(GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              *)&local_78.s,
            (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             *)&local_88.s,allocator);
  local_88.s.str = (Ch *)0x40500000018a037;
  local_88.n = (Number)0x8;
  local_78.n = (Number)0x0;
  local_78.s.str = (Ch *)((ulong)(ushort)((this->super_BaseConfig).m_autoSave + 9) << 0x30);
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  AddMember(&doc->
             super_GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
            ,(GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              *)&local_88.s,
            (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             *)&local_78.s,allocator);
  local_88.s.str = (Ch *)0x40500000018a040;
  local_88.n = (Number)0xa;
  local_78.n = (Number)0x0;
  local_78.s.str = (Ch *)((ulong)(ushort)((this->super_BaseConfig).m_background + 9) << 0x30);
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  AddMember(&doc->
             super_GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
            ,(GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              *)&local_88.s,
            (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             *)&local_78.s,allocator);
  local_88.s.str = (Ch *)0x40500000018a060;
  local_88.n = (Number)0x6;
  local_78.n = (Number)0x0;
  local_78.s.str = (Ch *)((ulong)(ushort)(Log::colors + 9) << 0x30);
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  AddMember(&doc->
             super_GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
            ,(GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              *)&local_88.s,
            (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             *)&local_78.s,allocator);
  CpuConfig::toJSON((CpuConfig *)&local_88.s,(Document *)this->d_ptr);
  local_78.s.str = (Ch *)0x40500000018a2b0;
  local_78.n = (Number)0x3;
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  AddMember(&doc->
             super_GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
            ,(GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              *)&local_78.s,
            (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             *)&local_88.s,allocator);
  OclConfig::toJSON((OclConfig *)&local_88.s,(Document *)&this->d_ptr->cl);
  local_78.s.str = (Ch *)0x40500000018a2e7;
  local_78.n = (Number)0x6;
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  AddMember(&doc->
             super_GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
            ,(GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              *)&local_78.s,
            (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             *)&local_88.s,allocator);
  CudaConfig::toJSON((CudaConfig *)&local_88.s,(Document *)&this->d_ptr->cuda);
  local_78.s.str = (Ch *)0x40500000018a32b;
  local_78.n = (Number)0x4;
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  AddMember(&doc->
             super_GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
            ,(GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              *)&local_78.s,
            (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             *)&local_88.s,allocator);
  String::toJSON((String *)&local_88.s);
  local_78.s.str = (Ch *)0x40500000018a067;
  local_78.n = (Number)0x8;
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  AddMember(&doc->
             super_GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
            ,(GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              *)&local_78.s,
            (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             *)&local_88.s,allocator);
  Pools::toJSON((Pools *)&local_88.s,(Document *)&(this->super_BaseConfig).m_pools);
  local_78.s.str = (Ch *)0x40500000018a363;
  local_78.n = (Number)0x5;
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  AddMember(&doc->
             super_GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
            ,(GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              *)&local_78.s,
            (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             *)&local_88.s,allocator);
  uVar1 = (this->super_BaseConfig).m_printTime;
  local_78._4_1_ = '\0';
  local_78._5_1_ = '\0';
  local_78._6_1_ = '\0';
  local_78._7_1_ = '\0';
  local_78._0_4_ = uVar1;
  local_88.s.str = (Ch *)0x40500000018a358;
  local_88.n = (Number)0xa;
  local_78.s.str = (Ch *)((ulong)(-1 < (int)uVar1) << 0x35 | 0x1d6000000000000);
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  AddMember(&doc->
             super_GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
            ,(GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              *)&local_88.s,
            (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             *)&local_78.s,allocator);
  uVar1 = this->d_ptr->healthPrintTime;
  local_78._4_1_ = '\0';
  local_78._5_1_ = '\0';
  local_78._6_1_ = '\0';
  local_78._7_1_ = '\0';
  local_78._0_4_ = uVar1;
  local_88.s.str = (Ch *)0x40500000018a351;
  local_88.n = (Number)0x11;
  local_78.s.str = (Ch *)((ulong)(-1 < (int)uVar1) << 0x35 | 0x1d6000000000000);
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  AddMember(&doc->
             super_GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
            ,(GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              *)&local_88.s,
            (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             *)&local_78.s,allocator);
  local_40.s = "retries";
  local_40.length = 7;
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  AddMember<int>(&doc->
                  super_GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                 ,&local_40,(this->super_BaseConfig).m_pools.m_retries,allocator);
  local_50.s = "retry-pause";
  local_50.length = 0xb;
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  AddMember<int>(&doc->
                  super_GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                 ,&local_50,(this->super_BaseConfig).m_pools.m_retryPause,allocator);
  local_88.s.str = (Ch *)0x40500000018a053;
  local_88.n = (Number)0x6;
  local_78.n = (Number)0x0;
  local_78.s.str = (Ch *)((ulong)(ushort)((this->super_BaseConfig).m_syslog + 9) << 0x30);
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  AddMember(&doc->
             super_GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
            ,(GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              *)&local_88.s,
            (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             *)&local_78.s,allocator);
  String::toJSON((String *)&local_88.s);
  local_78.s.str = (Ch *)0x40500000018a070;
  local_78.n = (Number)0xa;
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  AddMember(&doc->
             super_GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
            ,(GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              *)&local_78.s,
            (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             *)&local_88.s,allocator);
  local_88.s.str = (Ch *)0x40500000018a05a;
  local_88.n = (Number)0x5;
  local_78.n = (Number)0x0;
  local_78.s.str = (Ch *)((ulong)(ushort)((this->super_BaseConfig).m_watch + 9) << 0x30);
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  AddMember(&doc->
             super_GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
            ,(GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              *)&local_88.s,
            (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             *)&local_78.s,allocator);
  return;
}

Assistant:

void xmrig::Config::getJSON(rapidjson::Document &doc) const
{
    using namespace rapidjson;

    doc.SetObject();

    auto &allocator = doc.GetAllocator();

    Value api(kObjectType);
    api.AddMember("id",                m_apiId.toJSON(), allocator);
    api.AddMember("worker-id",         m_apiWorkerId.toJSON(), allocator);

    doc.AddMember("api",               api, allocator);
    doc.AddMember("http",              m_http.toJSON(doc), allocator);
    doc.AddMember("autosave",          isAutoSave(), allocator);
    doc.AddMember("background",        isBackground(), allocator);
    doc.AddMember("colors",            Log::colors, allocator);

    doc.AddMember(StringRef(kCPU),     cpu().toJSON(doc), allocator);

#   ifdef XMRIG_FEATURE_OPENCL
    doc.AddMember(StringRef(kOcl),     cl().toJSON(doc), allocator);
#   endif

#   ifdef XMRIG_FEATURE_CUDA
    doc.AddMember(StringRef(kCuda),    cuda().toJSON(doc), allocator);
#   endif

    doc.AddMember("log-file",                   m_logFile.toJSON(), allocator);
    doc.AddMember("pools",                      m_pools.toJSON(doc), allocator);
    doc.AddMember("print-time",                 printTime(), allocator);
#   if defined(XMRIG_FEATURE_NVML)
    doc.AddMember(StringRef(kHealthPrintTime),  healthPrintTime(), allocator);
#   endif
    doc.AddMember("retries",                    m_pools.retries(), allocator);
    doc.AddMember("retry-pause",                m_pools.retryPause(), allocator);
    doc.AddMember("syslog",                     isSyslog(), allocator);
    doc.AddMember("user-agent",                 m_userAgent.toJSON(), allocator);
    doc.AddMember("watch",                      m_watch, allocator);
}